

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualpage.cpp
# Opt level: O3

void __thiscall sai::VirtualPage::DecryptData(VirtualPage *this,uint32_t PageChecksum)

{
  uint uVar1;
  long lVar2;
  uint32_t PrevData;
  
  lVar2 = 0;
  do {
    uVar1 = *(uint *)(this + lVar2);
    *(uint *)(this + lVar2) =
         uVar1 - (*(int *)(Keys::User + (PageChecksum >> 0xe & 0x3fc)) +
                  *(int *)(Keys::User + (ulong)(PageChecksum >> 0x18) * 4) +
                  *(int *)(Keys::User + (ulong)(PageChecksum >> 8 & 0xff) * 4) +
                  *(int *)(Keys::User + (ulong)(PageChecksum & 0xff) * 4) ^ PageChecksum);
    lVar2 = lVar2 + 4;
    PageChecksum = uVar1;
  } while (lVar2 != 0x1000);
  return;
}

Assistant:

void VirtualPage::DecryptData(std::uint32_t PageChecksum)
{
	std::uint32_t PrevData = PageChecksum;
#if defined(__AVX2__)
	__m256i PrevData8 = _mm256_set1_epi32(PrevData);
	for( std::size_t i = 0; i < (PageSize / sizeof(std::uint32_t)); i += 8 )
	{
		const __m256i CurData8 = _mm256_loadu_si256((__m256i*)(u32 + i));
		// There is no true _mm_alignr_epi8 for AVX2
		// An extra _mm256_permute2x128_si256 is needed
		PrevData8 = _mm256_alignr_epi8(
			CurData8, _mm256_permute2x128_si256(PrevData8, CurData8, _MM_SHUFFLE(0, 2, 0, 1)),
			sizeof(std::uint32_t) * 3
		);
		__m256i CurPlain8 = _mm256_sub_epi32(
			CurData8, _mm256_xor_si256(PrevData8, KeySum8(PrevData8, Keys::User))
		);
		_mm256_storeu_si256((__m256i*)(u32 + i), CurPlain8);
		PrevData8 = CurData8;
	};
#else
	for( std::uint32_t& CurData : u32 )
	{
		const std::uint32_t LastData = CurData;
		CurData -= PrevData
				 ^ (Keys::User[(PrevData >> 24) & 0xFF] + Keys::User[(PrevData >> 16) & 0xFF]
					+ Keys::User[(PrevData >> 8) & 0xFF] + Keys::User[(PrevData >> 0) & 0xFF]);
		PrevData = LastData;
	}
#endif
}